

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropout.cpp
# Opt level: O0

int __thiscall ncnn::Dropout::forward_inplace(Dropout *this,Mat *bottom_top_blob)

{
  long in_RSI;
  long in_RDI;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff78;
  int local_78;
  Mat local_68;
  Mat *local_38;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  if ((*(float *)(in_RDI + 0x80) != 1.0) || (NAN(*(float *)(in_RDI + 0x80)))) {
    local_1c = *(int *)(in_RSI + 0x1c);
    local_20 = *(int *)(in_RSI + 0x20);
    local_24 = *(int *)(in_RSI + 0x24);
    local_28 = local_1c * local_20;
    for (local_2c = 0; local_2c < local_24; local_2c = local_2c + 1) {
      this_00 = &local_68;
      Mat::channel(in_stack_ffffffffffffff78,(int)((ulong)this_00 >> 0x20));
      in_stack_ffffffffffffff78 = (Mat *)Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x116c01);
      for (local_78 = 0; local_78 < local_28; local_78 = local_78 + 1) {
        *(float *)((long)&in_stack_ffffffffffffff78->data + (long)local_78 * 4) =
             *(float *)((long)&in_stack_ffffffffffffff78->data + (long)local_78 * 4) *
             *(float *)(in_RDI + 0x80);
      }
      local_38 = in_stack_ffffffffffffff78;
    }
  }
  return 0;
}

Assistant:

int Dropout::forward_inplace(Mat& bottom_top_blob) const
{
    if (scale == 1.f)
    {
        return 0;
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    #pragma omp parallel for
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * scale;
        }
    }

    return 0;
}